

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMan.c
# Opt level: O2

Cnf_Dat_t * Cnf_DataDup(Cnf_Dat_t *p)

{
  int iVar1;
  int **ppiVar2;
  Cnf_Dat_t *pCVar3;
  long lVar4;
  
  pCVar3 = Cnf_DataAlloc(p->pMan,p->nVars,p->nClauses,p->nLiterals);
  ppiVar2 = pCVar3->pClauses;
  memcpy(*ppiVar2,*p->pClauses,(long)p->nLiterals << 2);
  memcpy(pCVar3->pVarNums,p->pVarNums,(long)p->pMan->vObjs->nSize << 2);
  iVar1 = p->nClauses;
  for (lVar4 = 1; lVar4 < iVar1; lVar4 = lVar4 + 1) {
    ppiVar2[lVar4] = (int *)(((long)p->pClauses[lVar4] - (long)*p->pClauses) + (long)*ppiVar2);
  }
  return pCVar3;
}

Assistant:

Cnf_Dat_t * Cnf_DataDup( Cnf_Dat_t * p )
{
    Cnf_Dat_t * pCnf;
    int i;
    pCnf = Cnf_DataAlloc( p->pMan, p->nVars, p->nClauses, p->nLiterals );
    memcpy( pCnf->pClauses[0], p->pClauses[0], sizeof(int) * p->nLiterals );
    memcpy( pCnf->pVarNums, p->pVarNums, sizeof(int) * Aig_ManObjNumMax(p->pMan) );
    for ( i = 1; i < p->nClauses; i++ )
        pCnf->pClauses[i] = pCnf->pClauses[0] + (p->pClauses[i] - p->pClauses[0]);
    return pCnf;
}